

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

xmlChar * htmlParseNameComplex(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  xmlChar *pxVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  xmlParserInputPtr in_RAX;
  xmlChar *pxVar6;
  int len;
  int l;
  undefined8 uStack_38;
  
  do {
    pxVar1 = ctxt->input;
    pxVar6 = pxVar1->base;
    uStack_38 = in_RAX;
    if ((ctxt->progressive == 0) && ((long)pxVar1->end - (long)pxVar1->cur < 0xfa)) {
      xmlParserInputGrow(pxVar1,0xfa);
    }
    uVar3 = htmlCurrentChar(ctxt,(int *)((long)&uStack_38 + 4));
    if ((uVar3 < 0x3f) && ((0x4000800100000000U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
      return (xmlChar *)0x0;
    }
    if ((int)uVar3 < 0x100) {
      if ((((0x16 < uVar3 - 0xc0) && (0x19 < (uVar3 & 0xffffffdf) - 0x41)) &&
          ((int)uVar3 < 0xf8 && 0x1e < uVar3 - 0xd8)) && ((uVar3 != 0x5f && (uVar3 != 0x3a)))) {
        return (xmlChar *)0x0;
      }
    }
    else {
      iVar4 = xmlCharInRange(uVar3,&xmlIsBaseCharGroup);
      if ((iVar4 == 0) && ((8 < uVar3 - 0x3021 && 0x51a5 < uVar3 - 0x4e00) && uVar3 != 0x3007)) {
        return (xmlChar *)0x0;
      }
    }
    len = 0;
    iVar4 = 0;
    do {
      if ((uVar3 < 0x3f) && ((0x4000800100000000U >> ((ulong)uVar3 & 0x3f) & 1) != 0))
      goto LAB_0014fd4f;
      if ((int)uVar3 < 0x100) {
        if (((0x16 < uVar3 - 0xc0) && (0x19 < (uVar3 & 0xffffffdf) - 0x41)) &&
           ((9 < uVar3 - 0x30 && (((int)uVar3 < 0xf8 && (0x1e < uVar3 - 0xd8)))))) {
LAB_0014fc5d:
          if ((0x32 < uVar3 - 0x2d) ||
             ((0x4000000002003U >> ((ulong)(uVar3 - 0x2d) & 0x3f) & 1) == 0)) {
            if ((int)uVar3 < 0x100) {
              uVar3 = (uint)(uVar3 == 0xb7);
            }
            else {
              iVar5 = xmlCharInRange(uVar3,&xmlIsCombiningGroup);
              if (iVar5 != 0) goto LAB_0014fc7e;
              uVar3 = xmlCharInRange(uVar3,&xmlIsExtenderGroup);
            }
            if (uVar3 == 0) {
LAB_0014fd4f:
              pxVar6 = ctxt->input->cur;
              if ((long)pxVar6 - (long)ctxt->input->base < (long)len) {
                htmlParseErr(ctxt,XML_ERR_INTERNAL_ERROR,"unexpected change of input buffer",
                             (xmlChar *)0x0,(xmlChar *)0x0);
                return (xmlChar *)0x0;
              }
              pxVar6 = xmlDictLookup(ctxt->dict,pxVar6 + -(long)len,len);
              return pxVar6;
            }
          }
        }
      }
      else {
        iVar5 = xmlCharInRange(uVar3,&xmlIsBaseCharGroup);
        if (((iVar5 == 0) && ((8 < uVar3 - 0x3021 && 0x51a5 < uVar3 - 0x4e00) && uVar3 != 0x3007))
           && (iVar5 = xmlCharInRange(uVar3,&xmlIsDigitGroup), iVar5 == 0)) goto LAB_0014fc5d;
      }
LAB_0014fc7e:
      if (iVar4 < 0x65) {
        iVar4 = iVar4 + 1;
      }
      else {
        iVar4 = 0;
        if ((ctxt->progressive == 0) &&
           (pxVar1 = ctxt->input, iVar4 = 0, (long)pxVar1->end - (long)pxVar1->cur < 0xfa)) {
          xmlParserInputGrow(pxVar1,0xfa);
        }
      }
      pxVar1 = ctxt->input;
      pxVar2 = pxVar1->cur;
      if (*pxVar2 == '\n') {
        pxVar1->line = pxVar1->line + 1;
        pxVar1->col = 1;
      }
      else {
        pxVar1->col = pxVar1->col + 1;
      }
      len = len + uStack_38._4_4_;
      ctxt->token = 0;
      pxVar1->cur = pxVar2 + uStack_38._4_4_;
      uVar3 = htmlCurrentChar(ctxt,(int *)((long)&uStack_38 + 4));
      in_RAX = ctxt->input;
    } while (in_RAX->base == pxVar6);
  } while( true );
}

Assistant:

static const xmlChar *
htmlParseNameComplex(xmlParserCtxtPtr ctxt) {
    int len = 0, l;
    int c;
    int count = 0;
    const xmlChar *base = ctxt->input->base;

    /*
     * Handler for more complex cases
     */
    GROW;
    c = CUR_CHAR(l);
    if ((c == ' ') || (c == '>') || (c == '/') || /* accelerators */
	(!IS_LETTER(c) && (c != '_') &&
         (c != ':'))) {
	return(NULL);
    }

    while ((c != ' ') && (c != '>') && (c != '/') && /* test bigname.xml */
	   ((IS_LETTER(c)) || (IS_DIGIT(c)) ||
            (c == '.') || (c == '-') ||
	    (c == '_') || (c == ':') ||
	    (IS_COMBINING(c)) ||
	    (IS_EXTENDER(c)))) {
	if (count++ > 100) {
	    count = 0;
	    GROW;
	}
	len += l;
	NEXTL(l);
	c = CUR_CHAR(l);
	if (ctxt->input->base != base) {
	    /*
	     * We changed encoding from an unknown encoding
	     * Input buffer changed location, so we better start again
	     */
	    return(htmlParseNameComplex(ctxt));
	}
    }

    if (ctxt->input->cur - ctxt->input->base < len) {
        /* Sanity check */
	htmlParseErr(ctxt, XML_ERR_INTERNAL_ERROR,
                     "unexpected change of input buffer", NULL, NULL);
        return (NULL);
    }

    return(xmlDictLookup(ctxt->dict, ctxt->input->cur - len, len));
}